

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols.hpp
# Opt level: O0

void __thiscall cs::token_signal::token_signal(token_signal *this,signal_types t)

{
  compile_error *this_00;
  int in_ESI;
  token_base *in_RDI;
  string *in_stack_ffffffffffffff98;
  allocator local_31;
  string local_30 [36];
  int local_c;
  
  local_c = in_ESI;
  token_base::token_base(in_RDI);
  in_RDI->_vptr_token_base = (_func_int **)&PTR__token_signal_003ddd20;
  *(int *)&in_RDI[1]._vptr_token_base = local_c;
  if (local_c == 0x36) {
    this_00 = (compile_error *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Unknown signal.",&local_31);
    compile_error::compile_error(this_00,in_stack_ffffffffffffff98);
    __cxa_throw(this_00,&compile_error::typeinfo,compile_error::~compile_error);
  }
  return;
}

Assistant:

explicit token_signal(signal_types t) : mType(t)
		{
			if (t == signal_types::error_)
				throw compile_error("Unknown signal.");
		}